

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsd.cpp
# Opt level: O2

image_char new_image_char(uint xsize,uint ysize)

{
  image_char piVar1;
  uchar *puVar2;
  
  if ((xsize != 0) && (ysize != 0)) {
    piVar1 = (image_char)malloc(0x10);
    if (piVar1 != (image_char)0x0) {
      puVar2 = (uchar *)calloc((ulong)(ysize * xsize),1);
      piVar1->data = puVar2;
      if (puVar2 != (uchar *)0x0) {
        piVar1->xsize = xsize;
        piVar1->ysize = ysize;
        return piVar1;
      }
    }
    error("not enough memory.");
  }
  error("new_image_char: invalid image size.");
}

Assistant:

image_char new_image_char(unsigned int xsize, unsigned int ysize)
{
    image_char image;

    /* check parameters */
    if ( xsize == 0 || ysize == 0 ) error("new_image_char: invalid image size.");

    /* get memory */
    image = (image_char) malloc( sizeof(struct image_char_s) );
    if ( image == NULL ) error("not enough memory.");
    image->data = (unsigned char *) calloc( (size_t) (xsize * ysize),
                                            sizeof(unsigned char) );
    if ( image->data == NULL ) error("not enough memory.");

    /* set image size */
    image->xsize = xsize;
    image->ysize = ysize;

    return image;
}